

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O1

void icu_63::UCharsTrie::getNextBranchUChars(UChar *pos,int32_t length,Appendable *out)

{
  UChar UVar1;
  int32_t length_00;
  uint uVar2;
  UChar *pUVar3;
  int iVar4;
  ulong uVar5;
  UChar *pUVar6;
  
  uVar5 = (ulong)(uint)length;
  pUVar6 = pos;
  if (5 < length) {
    do {
      pos = pUVar6 + 2;
      UVar1 = pUVar6[1];
      uVar2 = (uint)(ushort)UVar1;
      pUVar3 = pos;
      if (0xfbff < (ushort)UVar1) {
        if (UVar1 == L'\xffff') {
          uVar2 = CONCAT22(pUVar6[2],pUVar6[3]);
          pUVar3 = pUVar6 + 4;
        }
        else {
          uVar2 = (uint)(ushort)UVar1 * 0x10000 + (uint)(ushort)pUVar6[2] + 0x4000000;
          pUVar3 = pUVar6 + 3;
        }
      }
      length_00 = (int32_t)(uVar5 >> 1);
      getNextBranchUChars(pUVar3 + (int)uVar2,length_00,out);
      if (0xfbff < (ushort)pUVar6[1]) {
        if (pUVar6[1] == L'\xffff') {
          pos = pUVar6 + 4;
        }
        else {
          pos = pUVar6 + 3;
        }
      }
      length = (int)uVar5 - length_00;
      uVar5 = (ulong)(uint)length;
      pUVar6 = pos;
    } while (5 < length);
  }
  iVar4 = length + 1;
  do {
    (*(out->super_UObject)._vptr_UObject[3])(out,(ulong)(ushort)*pos);
    if ((ushort)(pos[1] & 0x7fffU) < 0x4000) {
      pos = pos + 2;
    }
    else if ((pos[1] & 0x7fffU) == 0x7fff) {
      pos = pos + 4;
    }
    else {
      pos = pos + 3;
    }
    iVar4 = iVar4 + -1;
  } while (2 < iVar4);
  (*(out->super_UObject)._vptr_UObject[3])(out,(ulong)(ushort)*pos);
  return;
}

Assistant:

void
UCharsTrie::getNextBranchUChars(const UChar *pos, int32_t length, Appendable &out) {
    while(length>kMaxBranchLinearSubNodeLength) {
        ++pos;  // ignore the comparison unit
        getNextBranchUChars(jumpByDelta(pos), length>>1, out);
        length=length-(length>>1);
        pos=skipDelta(pos);
    }
    do {
        out.appendCodeUnit(*pos++);
        pos=skipValue(pos);
    } while(--length>1);
    out.appendCodeUnit(*pos);
}